

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlockfile.cpp
# Opt level: O0

bool __thiscall QLockFile::removeStaleLockFile(QLockFile *this)

{
  QLockFilePrivate *pQVar1;
  char *in_RDI;
  long in_FS_OFFSET;
  QLockFilePrivate *unaff_retaddr;
  QLockFilePrivate *d;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  bool bVar2;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QLockFile *)0x2d0585);
  if ((pQVar1->isLocked & 1U) == 0) {
    bVar2 = QLockFilePrivate::removeStaleLock(unaff_retaddr);
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
               in_RDI,(int)((ulong)pQVar1 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    QMessageLogger::warning
              (&local_28,"removeStaleLockFile can only be called when not holding the lock");
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QLockFile::removeStaleLockFile()
{
    Q_D(QLockFile);
    if (d->isLocked) {
        qWarning("removeStaleLockFile can only be called when not holding the lock");
        return false;
    }
    return d->removeStaleLock();
}